

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O2

int h264_coded_block_flag(bitstream *str,h264_cabac_context *cabac,int cat,int idx,uint32_t *val)

{
  int iVar1;
  h264_macroblock *phVar2;
  h264_macroblock *phVar3;
  uint inter;
  ulong uVar4;
  int local_4c;
  int idxA;
  int idxB;
  uint32_t *local_40;
  bitstream *local_38;
  
  local_38 = str;
  phVar2 = h264_mb_nb_p(cabac->slice,H264_MB_THIS,0);
  if ((uint)cat < 0xe) {
    uVar4 = (ulong)(uint)cat;
    inter = (uint)(0x1a < phVar2->mb_type);
    local_40 = val;
    switch(uVar4) {
    default:
      iVar1 = (*(code *)(&DAT_00129b4c + *(int *)(&DAT_00129b4c + uVar4 * 4)))();
      return iVar1;
    case 3:
      local_4c = idx + 1;
      phVar2 = h264_mb_nb(cabac->slice,H264_MB_A,inter);
      phVar3 = h264_mb_nb(cabac->slice,H264_MB_B,inter);
      idxA = 0x10;
      idxB = idxA;
      break;
    case 4:
      local_4c = (idx >> 3) + 1;
      phVar2 = h264_mb_nb_b(cabac->slice,H264_MB_A,H264_BLOCK_CHROMA,inter,idx & 7U,&idxA);
      phVar3 = h264_mb_nb_b(cabac->slice,H264_MB_B,H264_BLOCK_CHROMA,inter,idx & 7U,&idxB);
      break;
    case 6:
    case 7:
    case 8:
    case 9:
      iVar1 = (*(code *)(&DAT_00129b4c + *(int *)(&DAT_00129b4c + uVar4 * 4)))();
      return iVar1;
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
      iVar1 = (*(code *)(&DAT_00129b4c + *(int *)(&DAT_00129b4c + uVar4 * 4)))();
      return iVar1;
    }
    phVar2 = h264_inter_filter(cabac->slice,phVar2,inter);
    phVar3 = h264_inter_filter(cabac->slice,phVar3,inter);
    iVar1 = h264_cabac_decision(local_38,cabac,
                                h264_coded_block_flag::basectx[uVar4] +
                                phVar2->coded_block_flag[local_4c][idxA] +
                                phVar3->coded_block_flag[local_4c][idxB] * 2,local_40);
    return iVar1;
  }
  abort();
}

Assistant:

int h264_coded_block_flag(struct bitstream *str, struct h264_cabac_context *cabac, int cat, int idx, uint32_t *val) {
	static const int basectx[14] = {
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT0,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT1,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT2,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT3,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT4,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT5,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT6,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT7,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT8,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT9,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT10,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT11,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT12,
		H264_CABAC_CTXIDX_CODED_BLOCK_FLAG_CAT13,
	};
	const struct h264_macroblock *mbT = h264_mb_nb_p(cabac->slice, H264_MB_THIS, 0);
	int inter = h264_is_inter_mb_type(mbT->mb_type);
	int which;
	switch (cat) {
		case H264_CTXBLOCKCAT_LUMA_DC:
		case H264_CTXBLOCKCAT_LUMA_AC:
		case H264_CTXBLOCKCAT_LUMA_4X4:
		case H264_CTXBLOCKCAT_LUMA_8X8:
			which = 0;
			break;
		case H264_CTXBLOCKCAT_CB_DC:
		case H264_CTXBLOCKCAT_CB_AC:
		case H264_CTXBLOCKCAT_CB_4X4:
		case H264_CTXBLOCKCAT_CB_8X8:
			which = 1;
			break;
		case H264_CTXBLOCKCAT_CR_DC:
		case H264_CTXBLOCKCAT_CR_AC:
		case H264_CTXBLOCKCAT_CR_4X4:
		case H264_CTXBLOCKCAT_CR_8X8:
			which = 2;
			break;
		case H264_CTXBLOCKCAT_CHROMA_DC:
			which = idx + 1;
			break;
		case H264_CTXBLOCKCAT_CHROMA_AC:
			which = (idx >> 3) + 1;
			idx &= 7;
			break;
		default:
			abort();
	}
	const struct h264_macroblock *mbA;
	const struct h264_macroblock *mbB;
	int idxA;
	int idxB;
	switch (cat) {
		case H264_CTXBLOCKCAT_LUMA_DC:
		case H264_CTXBLOCKCAT_CB_DC:
		case H264_CTXBLOCKCAT_CR_DC:
		case H264_CTXBLOCKCAT_CHROMA_DC:
			mbA = h264_mb_nb(cabac->slice, H264_MB_A, inter);
			mbB = h264_mb_nb(cabac->slice, H264_MB_B, inter);
			idxA = 16;
			idxB = 16;
			break;
		case H264_CTXBLOCKCAT_LUMA_AC:
		case H264_CTXBLOCKCAT_LUMA_4X4:
		case H264_CTXBLOCKCAT_CB_AC:
		case H264_CTXBLOCKCAT_CB_4X4:
		case H264_CTXBLOCKCAT_CR_AC:
		case H264_CTXBLOCKCAT_CR_4X4:
			mbA = h264_mb_nb_b(cabac->slice, H264_MB_A, H264_BLOCK_4X4, inter, idx, &idxA);
			mbB = h264_mb_nb_b(cabac->slice, H264_MB_B, H264_BLOCK_4X4, inter, idx, &idxB);
			break;
		case H264_CTXBLOCKCAT_LUMA_8X8:
		case H264_CTXBLOCKCAT_CB_8X8:
		case H264_CTXBLOCKCAT_CR_8X8:
			mbA = h264_mb_nb_b(cabac->slice, H264_MB_A, H264_BLOCK_8X8, inter, idx, &idxA);
			mbB = h264_mb_nb_b(cabac->slice, H264_MB_B, H264_BLOCK_8X8, inter, idx, &idxB);
			idxA *= 4;
			idxB *= 4;
			if (!mbA->transform_size_8x8_flag && mbA->mb_type != H264_MB_TYPE_I_PCM && mbA->mb_type != H264_MB_TYPE_UNAVAIL)
				mbA = h264_mb_unavail(1);;
			if (!mbB->transform_size_8x8_flag && mbB->mb_type != H264_MB_TYPE_I_PCM && mbB->mb_type != H264_MB_TYPE_UNAVAIL)
				mbB = h264_mb_unavail(1);;
			break;
		case H264_CTXBLOCKCAT_CHROMA_AC:
			mbA = h264_mb_nb_b(cabac->slice, H264_MB_A, H264_BLOCK_CHROMA, inter, idx, &idxA);
			mbB = h264_mb_nb_b(cabac->slice, H264_MB_B, H264_BLOCK_CHROMA, inter, idx, &idxB);
			break;
		default:
			abort();
	}
	mbA = h264_inter_filter(cabac->slice, mbA, inter);
	mbB = h264_inter_filter(cabac->slice, mbB, inter);
	int condTermFlagA = mbA->coded_block_flag[which][idxA];
	int condTermFlagB = mbB->coded_block_flag[which][idxB];
	int ctxIdx = basectx[cat] + condTermFlagA + condTermFlagB * 2;
	return h264_cabac_decision(str, cabac, ctxIdx, val);
}